

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello_world.cpp
# Opt level: O2

void __thiscall hello::form(hello *this)

{
  bool bVar1;
  char cVar2;
  char cVar3;
  ostream *poVar4;
  undefined8 uVar5;
  double dVar6;
  string descr;
  locale loc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d60;
  form_context context;
  my_form f;
  
  my_form::my_form(&f);
  cppcms::application::request();
  cppcms::http::request::request_method_abi_cxx11_((request *)&context);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &context,"POST");
  std::__cxx11::string::~string((string *)&context);
  if (bVar1) {
    cppcms::application::context();
    cppcms::form::load((context *)&f);
    cVar2 = cppcms::form::validate();
  }
  else {
    cVar2 = '\0';
  }
  cppcms::application::response();
  poVar4 = (ostream *)cppcms::http::response::out();
  std::operator<<(poVar4,"<html><body>\n");
  cppcms::application::context();
  cppcms::http::context::locale();
  cVar3 = cppcms::widgets::base_widget::set();
  if (cVar3 != '\0') {
    cppcms::widgets::base_text::value_abi_cxx11_();
    cppcms::application::response();
    poVar4 = (ostream *)cppcms::http::response::out();
    poVar4 = std::operator<<(poVar4,"Upper: ");
    booster::locale::to_upper<char>
              (&descr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&context,
               &loc);
    poVar4 = std::operator<<(poVar4,(string *)&descr);
    poVar4 = std::operator<<(poVar4,"<br>");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&descr);
    cppcms::application::response();
    poVar4 = (ostream *)cppcms::http::response::out();
    poVar4 = std::operator<<(poVar4,"Lower: ");
    booster::locale::to_lower<char>
              (&descr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&context,
               &loc);
    poVar4 = std::operator<<(poVar4,(string *)&descr);
    poVar4 = std::operator<<(poVar4,"<br>");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&descr);
    cppcms::application::response();
    poVar4 = (ostream *)cppcms::http::response::out();
    poVar4 = std::operator<<(poVar4,"Title: ");
    booster::locale::to_title<char>
              (&descr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&context,
               &loc);
    poVar4 = std::operator<<(poVar4,(string *)&descr);
    poVar4 = std::operator<<(poVar4,"<br>");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&descr);
    cppcms::application::response();
    poVar4 = (ostream *)cppcms::http::response::out();
    poVar4 = std::operator<<(poVar4,"Fold Case: ");
    booster::locale::fold_case<char>
              (&descr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&context,
               &loc);
    poVar4 = std::operator<<(poVar4,(string *)&descr);
    poVar4 = std::operator<<(poVar4,"<br>");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&descr);
    std::__cxx11::string::~string((string *)&context);
  }
  cVar3 = cppcms::widgets::base_widget::set();
  if (cVar3 != '\0') {
    cppcms::widgets::base_text::value_abi_cxx11_();
    cVar3 = cppcms::widgets::base_widget::valid();
    if (cVar3 == '\0') {
      std::ofstream::ofstream(&context,"test.txt",_S_out);
      std::operator<<((ostream *)&context,(string *)&descr);
      std::ofstream::~ofstream(&context);
    }
    devide(this,character,&descr,"code");
    devide(this,word,&descr,"word");
    devide(this,sentence,&descr,"sentence");
    devide(this,line,&descr,"line");
    std::__cxx11::string::~string((string *)&descr);
  }
  if (cVar2 != '\0') {
    cppcms::application::response();
    poVar4 = (ostream *)cppcms::http::response::out();
    cppcms::widgets::base_text::value_abi_cxx11_();
    poVar4 = std::operator<<(poVar4,(string *)&context);
    std::operator<<(poVar4," ");
    dVar6 = cppcms::widgets::numeric<double>::value(&f.age);
    std::ostream::_M_insert<double>(dVar6);
    std::__cxx11::string::~string((string *)&context);
    cppcms::form::clear();
  }
  cppcms::application::response();
  poVar4 = (ostream *)cppcms::http::response::out();
  poVar4 = std::operator<<(poVar4,"<form action=\'");
  cppcms::application::request();
  cppcms::http::request::script_name_abi_cxx11_();
  cppcms::application::request();
  cppcms::http::request::path_info_abi_cxx11_();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&context,
                 &descr,&local_1d60);
  poVar4 = std::operator<<(poVar4,(string *)&context);
  std::operator<<(poVar4,"\' method=\'post\' enctype=\'multipart/form-data\' >\n<table>\n");
  std::__cxx11::string::~string((string *)&context);
  std::__cxx11::string::~string((string *)&local_1d60);
  std::__cxx11::string::~string((string *)&descr);
  cppcms::application::response();
  uVar5 = cppcms::http::response::out();
  cppcms::form_context::form_context(&context,uVar5,0,0);
  cppcms::form::render((form_context *)&f);
  cppcms::application::response();
  poVar4 = (ostream *)cppcms::http::response::out();
  std::operator<<(poVar4,"</table><input type=\'submit\' value=\'Send\' ></form>\n");
  cppcms::application::response();
  poVar4 = (ostream *)cppcms::http::response::out();
  poVar4 = std::operator<<(poVar4,"</form></body></html>");
  std::endl<char,std::char_traits<char>>(poVar4);
  cppcms::form_context::~form_context(&context);
  std::locale::~locale(&loc);
  my_form::~my_form(&f);
  return;
}

Assistant:

void form()
	{
		my_form f;
		bool ok=false;
		if(request().request_method()=="POST") {
			f.load(context());
			if(f.validate()) {
				ok=true;	
			}
		}
		response().out()<<
			"<html><body>\n";
	
		std::locale loc = context().locale();

		if(f.name.set()) {
			using namespace cppcms::locale;
			std::string name = f.name.value();
			response().out() <<"Upper: "<<to_upper(name,loc)<<"<br>"<<std::endl;
			response().out() <<"Lower: "<<to_lower(name,loc)<<"<br>"<<std::endl;
			#ifndef CPPCMS_DISABLE_ICU_LOCALIZATION
			response().out() <<"Title: "<<to_title(name,loc)<<"<br>"<<std::endl;
			response().out() <<"Fold Case: "<<fold_case(name,loc)<<"<br>"<<std::endl;
			#endif

		}
		if(f.description.set()) {
			std::string descr = f.description.value();
			if(!f.description.valid()) {
				std::ofstream tmp("test.txt");
				tmp<<descr;
			}
			#ifndef CPPCMS_DISABLE_ICU_LOCALIZATION
			using namespace cppcms::locale;
			devide(boundary::character,descr,"code");
			devide(boundary::word,descr,"word");
			devide(boundary::sentence,descr,"sentence");
			devide(boundary::line,descr,"line");
			#endif
		}

		if(ok) {
			response().out() << f.name.value() <<" " <<f.age.value();
			f.clear();
		}


		
		response().out()<<
			"<form action='" <<
				request().script_name() + request().path_info()
			<<  "' method='post' enctype='multipart/form-data' >\n"
			"<table>\n";

		cppcms::form_context context(response().out());
		f.render(context);

		response().out()<<"</table><input type='submit' value='Send' ></form>\n";
		response().out()<<"</form></body></html>"<<std::endl;
	}